

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unicode.cpp
# Opt level: O0

bool equal<tcb::unicode::detail::unicode_view<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,char16_t>,std::__cxx11::u16string>
               (unicode_view<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_char16_t>
                *r1,basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                    *r2)

{
  iterator __first1;
  iterator __last1;
  bool bVar1;
  const_iterator __first2;
  const_iterator __last2;
  iterator local_58;
  iterator local_38;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *local_18;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *r2_local;
  unicode_view<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_char16_t>
  *r1_local;
  
  local_18 = r2;
  r2_local = (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)r1;
  std::
  cbegin<tcb::unicode::detail::unicode_view<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,char16_t>>
            (&local_38,r1);
  std::
  cend<tcb::unicode::detail::unicode_view<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,char16_t>>
            (&local_58,
             (unicode_view<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_char16_t>
              *)r2_local);
  __first2 = std::cbegin<std::__cxx11::u16string>(local_18);
  __last2 = std::cend<std::__cxx11::u16string>(local_18);
  __first1.first_._M_current = local_38.first_._M_current;
  __first1.next_chars_ = local_38.next_chars_;
  __first1.last_._M_current = local_38.last_._M_current;
  __first1.idx_ = local_38.idx_;
  __first1._25_7_ = local_38._25_7_;
  __last1.first_._M_current = local_58.first_._M_current;
  __last1.next_chars_ = local_58.next_chars_;
  __last1.last_._M_current = local_58.last_._M_current;
  __last1.idx_ = local_58.idx_;
  __last1._25_7_ = local_58._25_7_;
  bVar1 = std::
          equal<tcb::unicode::detail::unicode_view<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,char16_t>::iterator,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>>
                    (__first1,__last1,
                     (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                      )__first2._M_current,
                     (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                      )__last2._M_current);
  return bVar1;
}

Assistant:

bool equal(const R1& r1, const R2& r2)
{
    return std::equal(std::cbegin(r1), std::cend(r1),
                      std::cbegin(r2), std::cend(r2));
}